

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O3

unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>
createColorPrimaries(khr_df_primaries_e primaries)

{
  tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_> extraout_RAX;
  tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_> extraout_RAX_00;
  tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_> extraout_RAX_01;
  tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_> extraout_RAX_02;
  tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_> extraout_RAX_03;
  tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_> extraout_RAX_04;
  tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_> extraout_RAX_05;
  tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_> extraout_RAX_06;
  tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_> extraout_RAX_07;
  ColorPrimariesAdobeRGB *this;
  __uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true>
  extraout_RAX_08;
  tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_> extraout_RAX_09;
  __uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> _Var1;
  undefined4 in_ESI;
  undefined4 in_register_0000003c;
  
  switch(in_ESI) {
  case 1:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesBT709::ColorPrimariesBT709((ColorPrimariesBT709 *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  case 2:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesBT601_625_EBU::ColorPrimariesBT601_625_EBU((ColorPrimariesBT601_625_EBU *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX_05.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  case 3:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesBT601_525_SMPTE::ColorPrimariesBT601_525_SMPTE
              ((ColorPrimariesBT601_525_SMPTE *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX_02.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  case 4:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesBT2020::ColorPrimariesBT2020((ColorPrimariesBT2020 *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX_03.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  case 5:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesCIEXYZ::ColorPrimariesCIEXYZ((ColorPrimariesCIEXYZ *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX_00.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  case 6:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesACES::ColorPrimariesACES((ColorPrimariesACES *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX_06.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  case 7:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesACEScc::ColorPrimariesACEScc((ColorPrimariesACEScc *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX_07.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  case 8:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesNTSC1953::ColorPrimariesNTSC1953((ColorPrimariesNTSC1953 *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX_04.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  case 9:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesPAL525::ColorPrimariesPAL525((ColorPrimariesPAL525 *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX_09.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  case 10:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesDisplayP3::ColorPrimariesDisplayP3((ColorPrimariesDisplayP3 *)this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX_01.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  case 0xb:
    this = (ColorPrimariesAdobeRGB *)operator_new(0x48);
    ColorPrimariesAdobeRGB::ColorPrimariesAdobeRGB(this);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         (tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
         extraout_RAX_08.
         super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
         _M_t.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                  ,0x5ac,
                  "std::unique_ptr<const ColorPrimaries> createColorPrimaries(khr_df_primaries_e)");
  }
  *(ColorPrimariesAdobeRGB **)CONCAT44(in_register_0000003c,primaries) = this;
  return (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>)
         _Var1._M_t.
         super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
         super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<const ColorPrimaries>
createColorPrimaries(khr_df_primaries_e primaries) {
    switch (primaries) {
    case KHR_DF_PRIMARIES_BT709:
        return std::make_unique<ColorPrimariesBT709>();
    case KHR_DF_PRIMARIES_BT601_EBU:
        return std::make_unique<ColorPrimariesBT601_625_EBU>();
    case KHR_DF_PRIMARIES_BT601_SMPTE:
        return std::make_unique<ColorPrimariesBT601_525_SMPTE>();
    case KHR_DF_PRIMARIES_BT2020:
        return std::make_unique<ColorPrimariesBT2020>();
    case KHR_DF_PRIMARIES_CIEXYZ:
        return std::make_unique<ColorPrimariesCIEXYZ>();
    case KHR_DF_PRIMARIES_ACES:
        return std::make_unique<ColorPrimariesACES>();
    case KHR_DF_PRIMARIES_ACESCC:
        return std::make_unique<ColorPrimariesACEScc>();
    case KHR_DF_PRIMARIES_NTSC1953:
        return std::make_unique<ColorPrimariesNTSC1953>();
    case KHR_DF_PRIMARIES_PAL525:
        return std::make_unique<ColorPrimariesPAL525>();
    case KHR_DF_PRIMARIES_DISPLAYP3:
        return std::make_unique<ColorPrimariesDisplayP3>();
    case KHR_DF_PRIMARIES_ADOBERGB:
        return std::make_unique<ColorPrimariesAdobeRGB>();
    default:
        assert(false);
        // We return BT709 by default if some error happened
        return std::make_unique<ColorPrimariesBT709>();
    }
}